

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O3

bool __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
IssuersMatch(CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
             *this,shared_ptr<const_bssl::ParsedCertificate> cert,
            ParsedCertificateList *expected_matches)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  long lVar3;
  pointer pIVar4;
  uchar *puVar5;
  pointer pIVar6;
  pointer psVar7;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  char *message;
  shared_ptr<const_bssl::ParsedCertificate> *it;
  pointer psVar11;
  shared_ptr<const_bssl::ParsedCertificate> *it_1;
  _func_int **pp_Var12;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_expected_matches;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_result_matches;
  ParsedCertificateList matches;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_a8;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_88;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->delegate_).source_.super_CertIssuerSource._vptr_CertIssuerSource[2])
            (&this->delegate_,
             cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  psVar7 = local_48.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (Input *)0x0;
  local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (Input *)0x0;
  local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Input *)0x0;
  if (local_48.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar11 = local_48.
              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar11->
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(peVar1->cert_).data_.data_;
      pIVar4 = (pointer)(peVar1->cert_).data_.size_;
      local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar4;
      if (local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
        _M_realloc_insert<bssl::der::Input>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Input *)&local_a8);
      }
      else {
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (undefined4)
             ((ulong)local_a8.
                     super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
                     .super__Vector_impl_data._M_start >> 0x20);
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(pIVar4,0);
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        *(undefined4 *)
         &((local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish)->data_).data_ =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_start._0_4_;
        *(undefined4 *)
         ((long)&((local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->data_).data_ + 4) =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_start._4_4_;
        *(undefined4 *)
         &((local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish)->data_).size_ =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish._0_4_;
        *(undefined4 *)
         ((long)&((local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->data_).size_ + 4) =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish._4_4_;
        local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pIVar6 = local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar4 = local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar7);
    if (local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar9 = (long)local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar4,pIVar6);
    }
  }
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (Input *)0x0;
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (Input *)0x0;
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Input *)0x0;
  pp_Var12 = (cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._M_pi)->_vptr__Sp_counted_base;
  pp_Var2 = *(_func_int ***)
             &(cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi)->_M_use_count;
  if (pp_Var12 != pp_Var2) {
    do {
      puVar5 = *(uchar **)(*pp_Var12 + 8);
      uStack_60 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (*pp_Var12 + 0x10);
      local_68 = (undefined1  [8])puVar5;
      if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
        _M_realloc_insert<bssl::der::Input>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Input *)local_68);
      }
      else {
        local_68._0_4_ = SUB84(puVar5,0);
        local_68._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
        uStack_60._4_4_ = (undefined4)((ulong)uStack_60 >> 0x20);
        *(undefined4 *)
         &((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish)->data_).data_ = local_68._0_4_;
        *(undefined4 *)
         ((long)&((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->data_).data_ + 4) = local_68._4_4_;
        *(undefined4 *)
         &((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish)->data_).size_ = (undefined4)uStack_60;
        *(undefined4 *)
         ((long)&((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->data_).size_ + 4) = uStack_60._4_4_;
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pIVar6 = local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar4 = local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pp_Var12 = pp_Var12 + 2;
    } while (pp_Var12 != pp_Var2);
    if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar9 = (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar4,pIVar6);
    }
  }
  if ((long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start ==
      (long)local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start) {
    bVar8 = ::std::__equal<false>::equal<bssl::der::Input_const*,bssl::der::Input_const*>
                      (local_a8.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_a8.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       local_88.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    bVar10 = true;
    if (bVar8) goto LAB_0020bb6b;
  }
  testing::internal::
  CmpHelperEQ<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>
            ((internal *)local_68,"der_expected_matches","der_result_matches",&local_a8,&local_88);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (uStack_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (uStack_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/cert_issuer_source_sync_unittest.h"
               ,0x7d,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (uStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,uStack_60);
  }
  bVar10 = false;
LAB_0020bb6b:
  if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start != (Input *)0x0) {
    operator_delete(local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start != (Input *)0x0) {
    operator_delete(local_88.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&local_48);
  return bVar10;
}

Assistant:

bool IssuersMatch(std::shared_ptr<const ParsedCertificate> cert,
                    ParsedCertificateList expected_matches) {
    ParsedCertificateList matches;
    source().SyncGetIssuersOf(cert.get(), &matches);

    std::vector<der::Input> der_result_matches;
    for (const auto &it : matches) {
      der_result_matches.push_back(it->der_cert());
    }
    std::sort(der_result_matches.begin(), der_result_matches.end());

    std::vector<der::Input> der_expected_matches;
    for (const auto &it : expected_matches) {
      der_expected_matches.push_back(it->der_cert());
    }
    std::sort(der_expected_matches.begin(), der_expected_matches.end());

    if (der_expected_matches == der_result_matches) {
      return true;
    }

    // Print some extra information for debugging.
    EXPECT_EQ(der_expected_matches, der_result_matches);
    return false;
  }